

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v11::basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::move
          (basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> *this
          ,basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>
           *other)

{
  buffer<unsigned_int> *buf_data;
  size_t sVar1;
  size_t buf_capacity;
  buffer<unsigned_int> *in_RSI;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> *in_RDI;
  size_t capacity;
  size_t size;
  uint *data;
  size_t in_stack_ffffffffffffffc8;
  
  buf_data = (buffer<unsigned_int> *)detail::buffer<unsigned_int>::data(in_RSI);
  sVar1 = detail::buffer<unsigned_int>::size(in_RSI);
  buf_capacity = detail::buffer<unsigned_int>::capacity(in_RSI);
  if (buf_data == in_RSI + 1) {
    detail::buffer<unsigned_int>::set
              (&in_RDI->super_buffer<unsigned_int>,in_RDI->store_,buf_capacity);
    detail::copy<unsigned_int,_unsigned_int_*,_unsigned_int_*,_0>
              ((uint *)(in_RSI + 1),(uint *)((long)&in_RSI[1].ptr_ + sVar1 * 4),in_RDI->store_);
  }
  else {
    detail::buffer<unsigned_int>::set
              (&in_RDI->super_buffer<unsigned_int>,(uint *)buf_data,buf_capacity);
    detail::buffer<unsigned_int>::set(in_RSI,(uint *)(in_RSI + 1),0);
    detail::buffer<unsigned_int>::clear(in_RSI);
  }
  resize(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

FMT_CONSTEXPR20 void move(basic_memory_buffer& other) {
    alloc_ = std::move(other.alloc_);
    T* data = other.data();
    size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      detail::copy<T>(other.store_, other.store_ + size, store_);
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
      other.clear();
    }
    this->resize(size);
  }